

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O0

Vec_Int_t * Gia_AigerReadMappingDoc(uchar **ppPos,int nObjs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *pArray;
  Vec_Int_t *pVVar5;
  int local_3c;
  int local_38;
  int nOffset;
  int k;
  int i;
  int nFanins;
  int iRoot;
  int LutSize;
  int nLuts;
  int *pMapping;
  int nObjs_local;
  uchar **ppPos_local;
  
  iVar1 = Gia_AigerReadInt(*ppPos);
  *ppPos = *ppPos + 4;
  iVar2 = Gia_AigerReadInt(*ppPos);
  *ppPos = *ppPos + 4;
  pArray = (int *)calloc((long)(nObjs + (iVar2 + 2) * iVar1),4);
  local_3c = nObjs;
  for (nOffset = 0; nOffset < iVar1; nOffset = nOffset + 1) {
    iVar3 = Gia_AigerReadInt(*ppPos);
    *ppPos = *ppPos + 4;
    iVar4 = Gia_AigerReadInt(*ppPos);
    *ppPos = *ppPos + 4;
    pArray[iVar3] = local_3c;
    pArray[local_3c] = iVar4;
    iVar2 = local_3c;
    for (local_38 = 0; local_3c = iVar2 + 1, local_38 < iVar4; local_38 = local_38 + 1) {
      iVar2 = Gia_AigerReadInt(*ppPos);
      pArray[local_3c] = iVar2;
      *ppPos = *ppPos + 4;
      iVar2 = local_3c;
    }
    pArray[local_3c] = iVar3;
    local_3c = iVar2 + 2;
  }
  pVVar5 = Vec_IntAllocArray(pArray,local_3c);
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_AigerReadMappingDoc( unsigned char ** ppPos, int nObjs )
{
    int * pMapping, nLuts, LutSize, iRoot, nFanins, i, k, nOffset;
    nLuts    = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    LutSize  = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    pMapping = ABC_CALLOC( int, nObjs + (LutSize + 2) * nLuts );
    nOffset = nObjs;
    for ( i = 0; i < nLuts; i++ )
    {
        iRoot   = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        nFanins = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        pMapping[iRoot] = nOffset;
        // write one
        pMapping[ nOffset++ ] = nFanins; 
        for ( k = 0; k < nFanins; k++ )
        {
            pMapping[ nOffset++ ] = Gia_AigerReadInt( *ppPos ); *ppPos += 4;
        }
        pMapping[ nOffset++ ] = iRoot; 
    }
    return Vec_IntAllocArray( pMapping, nOffset );
}